

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_fast.c
# Opt level: O3

size_t ZSTD_compressBlock_fast_extDict
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  uint uVar1;
  size_t sVar2;
  U32 mls;
  
  uVar1 = (ms->cParams).minMatch;
  mls = 4;
  if (uVar1 - 5 < 3) {
    mls = uVar1;
  }
  sVar2 = ZSTD_compressBlock_fast_extDict_generic(ms,seqStore,rep,src,srcSize,mls);
  return sVar2;
}

Assistant:

size_t ZSTD_compressBlock_fast_extDict(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    U32 const mls = ms->cParams.minMatch;
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_fast_extDict_generic(ms, seqStore, rep, src, srcSize, 4);
    case 5 :
        return ZSTD_compressBlock_fast_extDict_generic(ms, seqStore, rep, src, srcSize, 5);
    case 6 :
        return ZSTD_compressBlock_fast_extDict_generic(ms, seqStore, rep, src, srcSize, 6);
    case 7 :
        return ZSTD_compressBlock_fast_extDict_generic(ms, seqStore, rep, src, srcSize, 7);
    }
}